

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_predict_hbd_4x4_c(int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  int16_t *in_RSI;
  int in_R8D;
  int unaff_retaddr;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  cfl_predict_hbd_c(in_RSI,(uint16_t *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc,4,unaff_retaddr);
  return;
}

Assistant:

static void cfl_compute_parameters(MACROBLOCKD *const xd, TX_SIZE tx_size) {
  CFL_CTX *const cfl = &xd->cfl;
  // Do not call cfl_compute_parameters multiple time on the same values.
  assert(cfl->are_parameters_computed == 0);

  cfl_pad(cfl, tx_size_wide[tx_size], tx_size_high[tx_size]);
  cfl_get_subtract_average_fn(tx_size)(cfl->recon_buf_q3, cfl->ac_buf_q3);
  cfl->are_parameters_computed = 1;
}